

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall
GlobOptBlockData::MergeValueMaps
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  ushort uVar1;
  uint uVar2;
  SymID SVar3;
  Loop *pLVar4;
  ValueNumberPairToValueMap *pVVar5;
  BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills;
  GlobHashTable *pGVar6;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Value *pVVar8;
  Value *fromDataValue;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  Type pJVar9;
  Type pBVar10;
  BasicBlock *pBVar11;
  code *pcVar12;
  bool bVar13;
  BOOLEAN BVar14;
  undefined4 *puVar15;
  BVSparse<Memory::JitArenaAllocator> *pBVar16;
  Type *pTVar17;
  Type *pTVar18;
  Value **ppVVar19;
  Type_conflict pBVar20;
  Type *ppFVar21;
  Type_conflict pBVar22;
  BasicBlock *pBVar23;
  ulong uVar24;
  bool bVar25;
  undefined1 local_f8 [8];
  ValueSetByValueNumber mergedValues;
  ValueNumber local_78;
  uint local_74;
  undefined1 local_70 [8];
  EditingIterator iter;
  Value *local_48;
  Value *newValue;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *local_38;
  
  pLVar4 = toBlock->loop;
  if (pLVar4 == (Loop *)0x0) {
    bVar25 = false;
  }
  else {
    bVar25 = this->globOpt->prePassLoop == pLVar4;
  }
  uVar1 = *(ushort *)&toBlock->field_0x18;
  pVVar5 = this->globOpt->valuesCreatedForMerge;
  mergedValues.
  super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)symsCreatedForMerge;
  if (pVVar5->count != pVVar5->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2eb,"(this->globOpt->valuesCreatedForMerge->Count() == 0)",
                        "this->globOpt->valuesCreatedForMerge->Count() == 0");
    if (!bVar13) goto LAB_004992a9;
    *puVar15 = 0;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)local_f8,this->globOpt->tempAlloc,0x40);
  mergedValueTypesTrackedForKills = this->globOpt->tempBv;
  pBVar16 = mergedValueTypesTrackedForKills;
  do {
    pBVar16 = (BVSparse<Memory::JitArenaAllocator> *)pBVar16->head;
    if (pBVar16 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00498c46;
  } while (((Type *)&pBVar16->alloc)->word == 0);
  if (pBVar16 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar13 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2ef,"(mergedValueTypesTrackedForKills->IsEmpty())",
                        "mergedValueTypesTrackedForKills->IsEmpty()");
    if (!bVar13) {
LAB_004992a9:
      pcVar12 = (code *)invalidInstructionException();
      (*pcVar12)();
    }
    *puVar15 = 0;
  }
LAB_00498c46:
  JsUtil::
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->valuesToKillOnCalls->
           super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         );
  iter.last = (NodeBase *)this->symToValueMap;
  if (((GlobHashTable *)iter.last)->tableSize != 0) {
    pGVar6 = (fromBlock->globOptData).symToValueMap;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar24 = 0;
    local_74 = (uVar1 & 4) >> 2;
    do {
      newValue = (Value *)(pGVar6->table + uVar24);
      local_38 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 newValue;
      if ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue ==
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar13) goto LAB_004992a9;
        *puVar15 = 0;
      }
      pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
               (local_38->super_SListNodeBase<Memory::ArenaAllocator>).next;
      local_38 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                    newValue) {
        local_38 = pSVar7;
      }
      local_70 = (undefined1  [8])(iter.last[2].next + uVar24 * 2);
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_70;
      while( true ) {
        bVar13 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                 EditingIterator::Next((EditingIterator *)local_70);
        if (!bVar13) break;
        pTVar17 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_70);
        if ((local_38 !=
             (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           (local_38 !=
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue)) {
          while (uVar2 = pTVar17->value->m_id,
                pTVar18 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                          Iterator::Data((Iterator *)&newValue), uVar2 < pTVar18->value->m_id) {
            if (local_38 ==
                (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar13) goto LAB_004992a9;
              *puVar15 = 0;
            }
            pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                     (local_38->super_SListNodeBase<Memory::ArenaAllocator>).next;
            local_38 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
            if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                           *)newValue) {
              local_38 = pSVar7;
            }
            if ((local_38 ==
                 (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
               (local_38 ==
                (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue
               )) break;
          }
        }
        local_48 = (Value *)0x0;
        if ((local_38 !=
             (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           ((local_38 !=
             (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue &&
            (SVar3 = pTVar17->value->m_id,
            pTVar18 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)&newValue), SVar3 == pTVar18->value->m_id)))) {
          if ((uVar1 & 4) == 0) {
            bVar13 = false;
          }
          else {
            bVar13 = false;
            if ((pLVar4 != (Loop *)0x0) &&
               (bVar13 = false, this->globOpt->prePassLoop == (Loop *)0x0)) {
              BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (pLVar4->symsAssignedToInLoop,pTVar17->value->m_id);
              bVar13 = BVar14 != '\0';
            }
          }
          pVVar8 = pTVar17->element;
          pTVar18 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)&newValue);
          fromDataValue = pTVar18->element;
          pTVar18 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)&newValue);
          local_48 = MergeValues(this,pVVar8,fromDataValue,pTVar18->value,SUB41(local_74,0),bVar13,
                                 symsRequiringCompensation,
                                 (BVSparse<Memory::JitArenaAllocator> *)
                                 mergedValues.
                                 super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 .stats);
        }
        pSVar7 = iter.super_Iterator.list;
        if (local_48 == (Value *)0x0) {
          this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                    (iter.last)->next;
          SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
          ::UnlinkCurrentNode((EditingIterator *)local_70);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (this_00,pSVar7,0x18);
        }
        else {
          local_78 = local_48->valueNumber;
          ppVVar19 = JsUtil::
                     BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ::Lookup((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                               *)local_f8,&local_78);
          pVVar8 = *ppVVar19;
          if (pVVar8 == (Value *)0x0) {
            JsUtil::
            BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::Add((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)local_f8,&local_48);
          }
          else {
            BVar14 = BVSparse<Memory::JitArenaAllocator>::Test
                               (this->globOpt->byteCodeConstantValueNumbersBv,local_48->valueNumber)
            ;
            if ((BVar14 == '\0') && (local_48 != pVVar8)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x326,"(newValue == previouslyMergedValue)",
                                  "newValue == previouslyMergedValue");
              if (!bVar13) goto LAB_004992a9;
              *puVar15 = 0;
            }
          }
          GlobOpt::TrackMergedValueForKills
                    (this->globOpt,local_48,this,mergedValueTypesTrackedForKills);
          pTVar17->element = local_48;
          if (local_38 ==
              (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar13 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar13) goto LAB_004992a9;
            *puVar15 = 0;
          }
          pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   (local_38->super_SListNodeBase<Memory::ArenaAllocator>).next;
          local_38 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
          ;
          if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                        newValue) {
            local_38 = pSVar7;
          }
        }
      }
      if (((bVar25) && ((this->globOpt->rootLoopPrePass->field_0x178 & 0x80) == 0)) &&
         (local_38 !=
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue &&
          local_38 !=
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)) {
        do {
          pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   (local_38->super_SListNodeBase<Memory::ArenaAllocator>).next;
          local_38 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
          ;
          if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                        newValue) {
            local_38 = pSVar7;
          }
        } while ((local_38 !=
                  (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
                && (local_38 !=
                    (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                    newValue));
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < *(uint *)&iter.last[1].next);
  }
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(this->globOpt->valuesCreatedForMerge);
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Reset((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *)local_f8);
  if (mergedValueTypesTrackedForKills->head != (Type_conflict)0x0) {
    pJVar9 = mergedValueTypesTrackedForKills->alloc;
    pBVar10 = mergedValueTypesTrackedForKills->head;
    pBVar22 = pJVar9->bvFreeList;
    do {
      pBVar20 = pBVar10;
      pBVar10 = pBVar20->next;
      pBVar20->next = pBVar22;
      pBVar22 = pBVar20;
    } while (pBVar10 != (Type)0x0);
    pJVar9->bvFreeList = pBVar20;
  }
  mergedValueTypesTrackedForKills->head = (Type_conflict)0x0;
  mergedValueTypesTrackedForKills->lastFoundIndex = (Type_conflict)0x0;
  mergedValueTypesTrackedForKills->lastUsedNodePrevNextField =
       &mergedValueTypesTrackedForKills->head;
  ValueHashTable<ExprHash,_Value_*>::And
            (this->exprToValueMap,(fromBlock->globOptData).exprToValueMap);
  GlobOpt::ProcessValueKills(this->globOpt,toBlock,this);
  pSVar7 = iter.super_Iterator.list;
  if ((uVar1 & 4) == 0) {
LAB_0049928b:
    iter.super_Iterator.list = pSVar7;
    JsUtil::
    BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)local_f8);
    return;
  }
  GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(this->globOpt,toBlock,this);
  local_70 = (undefined1  [8])&toBlock->predList;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_70;
  puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  pBVar11 = (BasicBlock *)0x0;
LAB_00499178:
  pBVar23 = pBVar11;
  if (iter.super_Iterator.list ==
      (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar25 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                        ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar25) goto LAB_004992a9;
    *puVar15 = 0;
  }
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
       ((iter.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if ((undefined1  [8])iter.super_Iterator.list == local_70) goto LAB_0049928b;
  ppFVar21 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_70);
  pBVar11 = (*ppFVar21)->predBlock;
  if (pBVar11 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar25 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x34e,"(pred)","pred");
    if (!bVar25) goto LAB_004992a9;
    *puVar15 = 0;
  }
  if ((pBVar23 != (BasicBlock *)0x0) && (pBVar11->number <= pBVar23->number)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar15 = 1;
    bVar25 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x350,"(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum())",
                        "!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum()");
    if (!bVar25) goto LAB_004992a9;
    *puVar15 = 0;
  }
  goto LAB_00499178;
}

Assistant:

void
GlobOptBlockData::MergeValueMaps(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);
    bool isLoopBackEdge = toBlock->isLoopHeader;
    Loop *loop = toBlock->loop;
    bool isLoopPrepass = (loop && this->globOpt->prePassLoop == loop);

    Assert(this->globOpt->valuesCreatedForMerge->Count() == 0);
    DebugOnly(ValueSetByValueNumber mergedValues(this->globOpt->tempAlloc, 64));

    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills = this->globOpt->tempBv;
    Assert(mergedValueTypesTrackedForKills->IsEmpty());
    this->valuesToKillOnCalls->Clear(); // the tracking will be reevaluated based on merged value types

    GlobHashTable *thisTable = this->symToValueMap;
    GlobHashTable *otherTable = fromData->symToValueMap;
    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        SListBase<GlobHashBucket>::Iterator iter2(&otherTable->table[i]);
        iter2.Next();
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            while (iter2.IsValid() && bucket.value->m_id < iter2.Data().value->m_id)
            {
                iter2.Next();
            }
            Value *newValue = nullptr;

            if (iter2.IsValid() && bucket.value->m_id == iter2.Data().value->m_id)
            {
                // Syms that are assigned to within the loop must have unique
                // value numbers in the loop header after merging; a single
                // prepass is not adequate to determine that sym values are
                // equivalent through all possible loop paths.
                bool forceUniqueValue =
                    isLoopBackEdge &&
                    !this->globOpt->IsLoopPrePass() &&
                    loop &&
                    loop->symsAssignedToInLoop->Test(bucket.value->m_id);

                newValue =
                    this->MergeValues(
                        bucket.element,
                        iter2.Data().element,
                        iter2.Data().value,
                        isLoopBackEdge,
                        forceUniqueValue,
                        symsRequiringCompensation,
                        symsCreatedForMerge);
            }
            if (newValue == nullptr)
            {
                iter.RemoveCurrent(thisTable->alloc);
                continue;
            }
            else
            {
#if DBG
                // Ensure that only one value per value number is produced by merge. Byte-code constant values are reused in
                // multiple blocks without cloning, so exclude those value numbers.
                {
                    Value *const previouslyMergedValue = mergedValues.Lookup(newValue->GetValueNumber());
                    if (previouslyMergedValue)
                    {
                        if (!this->globOpt->byteCodeConstantValueNumbersBv->Test(newValue->GetValueNumber()))
                        {
                            Assert(newValue == previouslyMergedValue);
                        }
                    }
                    else
                    {
                        mergedValues.Add(newValue);
                    }
                }
#endif

                this->globOpt->TrackMergedValueForKills(newValue, this, mergedValueTypesTrackedForKills);
                bucket.element = newValue;
            }
            iter2.Next();
        } NEXT_SLISTBASE_ENTRY_EDITING;

        if (isLoopPrepass && !this->globOpt->rootLoopPrePass->allFieldsKilled)
        {
            while (iter2.IsValid())
            {
                iter2.Next();
            }
        }
    }

    this->globOpt->valuesCreatedForMerge->Clear();
    DebugOnly(mergedValues.Reset());
    mergedValueTypesTrackedForKills->ClearAll();

    this->exprToValueMap->And(fromData->exprToValueMap);

    this->globOpt->ProcessValueKills(toBlock, this);

    bool isLastLoopBackEdge = false;

    if (isLoopBackEdge)
    {
        this->globOpt->ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(toBlock, this);

        BasicBlock *lastBlock = nullptr;
        FOREACH_PREDECESSOR_BLOCK(pred, toBlock)
        {
            Assert(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum());
            lastBlock = pred;
        }NEXT_PREDECESSOR_BLOCK;
        isLastLoopBackEdge = (lastBlock == fromBlock);
    }
}